

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O1

int ffpthp(fitsfile *fptr,long theap,int *status)

{
  int iVar1;
  
  iVar1 = *status;
  if (0 < theap && iVar1 < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    fptr->Fptr->heapstart = theap;
    ffukyj(fptr,"THEAP",theap,"byte offset to heap area",status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffpthp(fitsfile *fptr,      /* I - FITS file pointer */
           long theap,          /* I - starting addrss for the heap */
           int *status)         /* IO - error status     */
/*
  Define the starting address for the heap for a binary table.
  The default address is NAXIS1 * NAXIS2.  It is in units of
  bytes relative to the beginning of the regular binary table data.
  This routine also writes the appropriate THEAP keyword to the
  FITS header.
*/
{
    if (*status > 0 || theap < 1)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->heapstart = theap;

    ffukyj(fptr, "THEAP", theap, "byte offset to heap area", status);

    return(*status);
}